

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls,U32 hasStep)

{
  uint *iEnd;
  BYTE *pBVar1;
  BYTE *iStart;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  seqStore_t *psVar5;
  seqStore_t *psVar6;
  seqStore_t *psVar7;
  uint uVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint *ilimit_w;
  size_t sVar13;
  byte bVar14;
  uint uVar15;
  BYTE *pBVar16;
  ulong uVar17;
  int *piVar18;
  uint uVar19;
  uint *puVar20;
  seqStore_t *psVar21;
  uint *puVar22;
  long lVar23;
  uint *iend;
  uint *ip;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  seqDef *psVar27;
  seqStore_t *psVar28;
  BYTE *pBVar29;
  BYTE *pBVar30;
  uint *puVar31;
  uint *puVar32;
  ulong uVar33;
  uint *puVar34;
  int iVar35;
  uint uVar36;
  uint *puVar37;
  uint *puVar38;
  uint uVar39;
  ulong uVar40;
  U32 UVar41;
  ulong uVar42;
  uint local_ec;
  uint local_e8;
  ulong local_d0;
  
  uVar15 = (ms->cParams).targetLength;
  uVar40 = (ulong)(uVar15 + 1 + (uint)(uVar15 == 0));
  psVar5 = (seqStore_t *)(ms->window).base;
  iVar10 = (int)psVar5;
  iVar35 = (int)src - iVar10;
  iVar24 = (int)srcSize + iVar35;
  uVar36 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar15 = (ms->window).lowLimit;
  uVar8 = iVar24 - uVar36;
  if (iVar24 - uVar15 <= uVar36) {
    uVar8 = uVar15;
  }
  if (ms->loadedDictEnd != 0) {
    uVar8 = uVar15;
  }
  uVar15 = (ms->window).dictLimit;
  if (uVar15 <= uVar8) {
    sVar13 = ZSTD_compressBlock_fast(ms,seqStore,rep,src,srcSize);
    return sVar13;
  }
  pBVar16 = (BYTE *)(ulong)uVar15;
  iEnd = (uint *)((long)src + srcSize);
  puVar37 = (uint *)((long)src + (srcSize - 8));
  uVar36 = *rep;
  uVar4 = rep[1];
  uVar11 = iVar35 - uVar8;
  local_ec = 0;
  if (uVar4 < uVar11) {
    local_ec = uVar4;
    uVar4 = 0;
  }
  local_e8 = 0;
  uVar12 = uVar36;
  if (uVar36 < uVar11) {
    uVar12 = 0;
    local_e8 = uVar36;
  }
  puVar31 = (uint *)((long)src + uVar40 + 1);
  ip = (uint *)src;
  if (puVar31 < puVar37) {
    uVar36 = (ms->cParams).hashLog;
    iVar35 = uVar36 - 0x20;
    if (0x1f < uVar36 && iVar35 != 0) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    psVar6 = (seqStore_t *)ms->hashTable;
    psVar7 = (seqStore_t *)(ms->window).dictBase;
    pBVar1 = (BYTE *)((long)&psVar7->sequencesStart + (ulong)uVar8);
    iStart = pBVar16 + (long)&psVar5->sequencesStart;
    puVar20 = (uint *)(pBVar16 + (long)psVar7);
    puVar22 = (uint *)((long)src + uVar40);
    bVar14 = -(char)iVar35;
    ilimit_w = iEnd + -8;
    uVar36 = mls - 5;
    uVar33 = (ulong)uVar36;
    psVar21 = seqStore;
    pBVar29 = iStart;
    do {
      if (uVar36 < 4) {
        sVar13 = (*(code *)(&DAT_002fa7fc + *(int *)(&DAT_002fa7fc + uVar33 * 4)))
                           (pBVar29,psVar21,psVar6);
        return sVar13;
      }
      uVar42 = (ulong)(*ip * -0x61c8864f >> (bVar14 & 0x1f));
      uVar19 = (uint)(*(int *)((long)ip + 1) * -0x61c8864f) >> (bVar14 & 0x1f);
      puVar38 = (uint *)((long)ip + 1);
      puVar34 = ip + 0x20;
      uVar11 = *(uint *)((long)&psVar6->sequencesStart + uVar42 * 4);
      psVar21 = psVar5;
      iend = ip;
      uVar26 = uVar40;
      if (uVar11 < uVar15) {
        psVar21 = psVar7;
      }
      while( true ) {
        puVar32 = puVar31;
        local_d0 = (ulong)uVar19;
        uVar17 = (ulong)uVar11;
        uVar19 = ((int)puVar22 - iVar10) - local_e8;
        psVar28 = psVar5;
        if (uVar19 < uVar15) {
          psVar28 = psVar7;
        }
        if ((local_e8 == 0) || (uVar15 - uVar19 < 4)) {
          uVar25 = *puVar22 ^ 1;
        }
        else {
          uVar25 = *(uint *)((long)&psVar28->sequencesStart + (ulong)uVar19);
        }
        uVar39 = (int)iend - iVar10;
        *(uint *)((long)&psVar6->sequencesStart + uVar42 * 4) = uVar39;
        puVar31 = iEnd;
        if (*puVar22 == uVar25) {
          pBVar29 = (BYTE *)((long)&psVar28->sequencesStart + (ulong)uVar19);
          if ((pBVar29 == iStart) || (pBVar29 == pBVar1)) {
            __assert_fail("(match0 != prefixStart) & (match0 != dictStart)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x72c6,
                          "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                         );
          }
          if (uVar19 < uVar15) {
            puVar31 = puVar20;
          }
          uVar26 = (ulong)(*(BYTE *)((long)puVar22 + -1) == pBVar29[-1]);
          iend = (uint *)((long)puVar22 - uVar26);
          pBVar29 = pBVar29 + -uVar26;
          uVar26 = uVar26 | 4;
          UVar41 = 1;
          goto LAB_001ae72c;
        }
        if ((uVar8 <= uVar11) && (*iend == *(uint *)((long)&psVar21->sequencesStart + uVar17)))
        break;
        uVar11 = *(uint *)((long)&psVar6->sequencesStart + local_d0 * 4);
        uVar17 = (ulong)uVar11;
        psVar21 = psVar5;
        if (uVar11 < uVar15) {
          psVar21 = psVar7;
        }
        if (uVar36 < 4) {
          sVar13 = (*(code *)(&DAT_002fa80c + *(int *)(&DAT_002fa80c + uVar33 * 4)))();
          return sVar13;
        }
        uVar42 = (ulong)(*puVar22 * -0x61c8864f >> (bVar14 & 0x1f));
        uVar39 = (int)puVar38 - iVar10;
        *(uint *)((long)&psVar6->sequencesStart + local_d0 * 4) = uVar39;
        if ((uVar8 <= uVar11) &&
           (uVar11 = *puVar38, iend = puVar38, puVar38 = puVar22, local_d0 = uVar42,
           uVar11 == *(uint *)((long)&psVar21->sequencesStart + uVar17))) break;
        uVar11 = *(uint *)((long)&psVar6->sequencesStart + uVar42 * 4);
        psVar21 = psVar5;
        if (uVar11 < uVar15) {
          psVar21 = psVar7;
        }
        if (uVar36 < 4) {
          sVar13 = (*(code *)(&DAT_002fa81c + *(int *)(&DAT_002fa81c + uVar33 * 4)))();
          return sVar13;
        }
        uVar19 = *puVar32 * -0x61c8864f >> (bVar14 & 0x1f);
        uVar17 = uVar26;
        if (puVar34 <= (uint *)(uVar26 + (long)puVar22)) {
          puVar34 = puVar34 + 0x20;
          uVar17 = uVar26 + 1;
        }
        puVar31 = (uint *)(uVar26 + (long)puVar32);
        iend = puVar22;
        puVar38 = puVar32;
        puVar22 = (uint *)(uVar26 + (long)puVar22);
        uVar26 = uVar17;
        if (puVar37 <= puVar31) goto LAB_001aec21;
      }
      pBVar2 = iStart;
      if ((uint)uVar17 < uVar15) {
        puVar31 = puVar20;
        pBVar2 = pBVar1;
      }
      uVar11 = uVar39 - (uint)uVar17;
      if (uVar11 == 0) {
        __assert_fail("(offset)>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7326,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                     );
      }
      pBVar29 = (BYTE *)((long)&psVar21->sequencesStart + uVar17);
      UVar41 = uVar11 + 3;
      uVar26 = 4;
      if ((pBVar2 < pBVar29) && (ip < iend)) {
        pBVar29 = (BYTE *)((long)&psVar21->sequencesStart + uVar17);
        do {
          pBVar30 = pBVar29 + -1;
          puVar22 = (uint *)((long)iend + -1);
          if ((*(BYTE *)puVar22 != *pBVar30) ||
             (uVar26 = uVar26 + 1, iend = puVar22, pBVar29 = pBVar30, pBVar30 <= pBVar2)) break;
        } while (ip < puVar22);
      }
      local_ec = local_e8;
      local_e8 = uVar11;
LAB_001ae72c:
      if (puVar31 == (uint *)0x0) {
        __assert_fail("matchEnd != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7333,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                     );
      }
      sVar13 = ZSTD_count_2segments
                         ((BYTE *)((long)iend + uVar26),pBVar29 + uVar26,(BYTE *)iEnd,
                          (BYTE *)puVar31,iStart);
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001aecac:
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
LAB_001aec8d:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar42 = (long)iend - (long)ip;
      pBVar29 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar29 + uVar42) {
LAB_001aeccb:
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (iEnd < iend) {
LAB_001aecea:
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (ilimit_w < iend) {
        ZSTD_safecopyLiterals(pBVar29,(BYTE *)ip,(BYTE *)iend,(BYTE *)ilimit_w);
LAB_001ae7d5:
        seqStore->lit = seqStore->lit + uVar42;
        if (0xffff < uVar42) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar9 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar29 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar29 + 8) = uVar9;
        pBVar29 = seqStore->lit;
        if (0x10 < uVar42) {
          if ((BYTE *)0xffffffffffffffe0 < pBVar29 + 0x10 + (-0x10 - (long)(ip + 4))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar9 = *(undefined8 *)(ip + 6);
          *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)(ip + 4);
          *(undefined8 *)(pBVar29 + 0x18) = uVar9;
          if (0x20 < (long)uVar42) {
            lVar23 = 0;
            do {
              puVar3 = (undefined8 *)((long)ip + lVar23 + 0x20);
              uVar9 = puVar3[1];
              pBVar2 = pBVar29 + lVar23 + 0x20;
              *(undefined8 *)pBVar2 = *puVar3;
              *(undefined8 *)(pBVar2 + 8) = uVar9;
              puVar3 = (undefined8 *)((long)ip + lVar23 + 0x30);
              uVar9 = puVar3[1];
              *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
              *(undefined8 *)(pBVar2 + 0x18) = uVar9;
              lVar23 = lVar23 + 0x20;
            } while (pBVar2 + 0x20 < pBVar29 + uVar42);
          }
          goto LAB_001ae7d5;
        }
        seqStore->lit = pBVar29 + uVar42;
      }
      uVar26 = sVar13 + uVar26;
      psVar27 = seqStore->sequences;
      psVar27->litLength = (U16)uVar42;
      psVar27->offBase = UVar41;
      if (uVar26 < 3) {
LAB_001aec6e:
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < uVar26 - 3) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001aed09:
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar27 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar27->mlBase = (U16)(uVar26 - 3);
      psVar27 = psVar27 + 1;
      seqStore->sequences = psVar27;
      ip = (uint *)((long)iend + uVar26);
      if (puVar38 < ip) {
        *(int *)((long)&psVar6->sequencesStart + local_d0 * 4) = (int)puVar38 - iVar10;
      }
      psVar21 = psVar6;
      if (ip <= puVar37) {
        piVar18 = (int *)((long)&psVar5->sequencesStart + (ulong)uVar39 + 2);
        if (piVar18 <= src) {
          __assert_fail("base+current0+2 > istart",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7343,
                        "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                       );
        }
        if (uVar36 < 4) {
          sVar13 = (*(code *)(&DAT_002fa82c + *(int *)(&DAT_002fa82c + uVar33 * 4)))();
          return sVar13;
        }
        *(uint *)((long)&psVar6->sequencesStart +
                 (ulong)((uint)(*piVar18 * -0x61c8864f) >> (bVar14 & 0x1f)) * 4) = uVar39 + 2;
        *(int *)((long)&psVar6->sequencesStart +
                (ulong)((uint)(*(int *)((long)ip + -2) * -0x61c8864f) >> (bVar14 & 0x1f)) * 4) =
             ((int)ip + -2) - iVar10;
        do {
          uVar19 = local_ec;
          iVar35 = (int)ip - iVar10;
          uVar11 = iVar35 - uVar19;
          psVar21 = psVar5;
          if (uVar11 < uVar15) {
            psVar21 = psVar7;
          }
          local_ec = uVar19;
          if (((uVar19 == 0) || (0xfffffffc < uVar11 - uVar15)) ||
             (psVar21 = (seqStore_t *)((long)&psVar21->sequencesStart + (ulong)uVar11),
             *(uint *)&psVar21->sequencesStart != *ip)) break;
          puVar31 = iEnd;
          if (uVar11 < uVar15) {
            puVar31 = puVar20;
          }
          sVar13 = ZSTD_count_2segments
                             ((BYTE *)(ip + 1),(BYTE *)((long)&psVar21->sequencesStart + 4),
                              (BYTE *)iEnd,(BYTE *)puVar31,iStart);
          if (seqStore->maxNbSeq <= (ulong)((long)psVar27 - (long)seqStore->sequencesStart >> 3))
          goto LAB_001aecac;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001aec8d;
          puVar31 = (uint *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < puVar31) goto LAB_001aeccb;
          if (iEnd < ip) goto LAB_001aecea;
          if (ilimit_w < ip) {
            ZSTD_safecopyLiterals((BYTE *)puVar31,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
          }
          else {
            uVar11 = ip[1];
            uVar25 = ip[2];
            uVar39 = ip[3];
            *puVar31 = *ip;
            puVar31[1] = uVar11;
            puVar31[2] = uVar25;
            puVar31[3] = uVar39;
          }
          psVar27 = seqStore->sequences;
          psVar27->litLength = 0;
          psVar27->offBase = 1;
          if (sVar13 + 4 < 3) goto LAB_001aec6e;
          if (0xffff < sVar13 + 1) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001aed09;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar27 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar27->mlBase = (U16)(sVar13 + 1);
          psVar27 = psVar27 + 1;
          seqStore->sequences = psVar27;
          if (uVar36 < 4) {
            sVar13 = (*(code *)(&DAT_002fa83c + *(int *)(&DAT_002fa83c + uVar33 * 4)))();
            return sVar13;
          }
          *(int *)((long)&psVar6->sequencesStart + (ulong)(*ip * -0x61c8864f >> (bVar14 & 0x1f)) * 4
                  ) = iVar35;
          ip = (uint *)((long)ip + sVar13 + 4);
          psVar21 = psVar6;
          local_ec = local_e8;
          local_e8 = uVar19;
        } while (ip <= puVar37);
      }
      puVar22 = (uint *)((long)ip + uVar40);
      puVar31 = (uint *)((long)ip + uVar40 + 1);
      pBVar29 = pBVar16;
    } while (puVar31 < puVar37);
  }
LAB_001aec21:
  uVar15 = uVar12;
  if (local_e8 == 0) {
    local_e8 = uVar12;
    uVar15 = uVar4;
  }
  if (uVar12 == 0) {
    uVar15 = uVar4;
  }
  if (local_ec != 0) {
    uVar15 = local_ec;
  }
  *rep = local_e8;
  rep[1] = uVar15;
  return (long)iEnd - (long)ip;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls, U32 const hasStep)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    size_t const stepSize = cParams->targetLength + !(cParams->targetLength) + 1;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];
    U32 offsetSaved1 = 0, offsetSaved2 = 0;

    const BYTE* ip0 = istart;
    const BYTE* ip1;
    const BYTE* ip2;
    const BYTE* ip3;
    U32 current0;


    size_t hash0; /* hash for ip0 */
    size_t hash1; /* hash for ip1 */
    U32 idx; /* match idx for ip0 */
    const BYTE* idxBase; /* base pointer for idx */

    U32 offcode;
    const BYTE* match0;
    size_t mLength;
    const BYTE* matchEnd = 0; /* initialize to avoid warning, assert != 0 later */

    size_t step;
    const BYTE* nextStep;
    const size_t kStepIncr = (1 << (kSearchStrength - 1));

    (void)hasStep; /* not currently specialized on whether it's accelerated */

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic (offset_1=%u)", offset_1);

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast(ms, seqStore, rep, src, srcSize);

    {   U32 const curr = (U32)(ip0 - base);
        U32 const maxRep = curr - dictStartIndex;
        if (offset_2 >= maxRep) offsetSaved2 = offset_2, offset_2 = 0;
        if (offset_1 >= maxRep) offsetSaved1 = offset_1, offset_1 = 0;
    }

    /* start each op */
_start: /* Requires: ip0 */

    step = stepSize;
    nextStep = ip0 + kStepIncr;

    /* calculate positions, ip0 - anchor == 0, so we skip step calc */
    ip1 = ip0 + 1;
    ip2 = ip0 + step;
    ip3 = ip2 + 1;

    if (ip3 >= ilimit) {
        goto _cleanup;
    }

    hash0 = ZSTD_hashPtr(ip0, hlog, mls);
    hash1 = ZSTD_hashPtr(ip1, hlog, mls);

    idx = hashTable[hash0];
    idxBase = idx < prefixStartIndex ? dictBase : base;

    do {
        {   /* load repcode match for ip[2] */
            U32 const current2 = (U32)(ip2 - base);
            U32 const repIndex = current2 - offset_1;
            const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
            U32 rval;
            if ( ((U32)(prefixStartIndex - repIndex) >= 4) /* intentional underflow */
                 & (offset_1 > 0) ) {
                rval = MEM_read32(repBase + repIndex);
            } else {
                rval = MEM_read32(ip2) ^ 1; /* guaranteed to not match. */
            }

            /* write back hash table entry */
            current0 = (U32)(ip0 - base);
            hashTable[hash0] = current0;

            /* check repcode at ip[2] */
            if (MEM_read32(ip2) == rval) {
                ip0 = ip2;
                match0 = repBase + repIndex;
                matchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
                assert((match0 != prefixStart) & (match0 != dictStart));
                mLength = ip0[-1] == match0[-1];
                ip0 -= mLength;
                match0 -= mLength;
                offcode = REPCODE1_TO_OFFBASE;
                mLength += 4;
                goto _match;
        }   }

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip3;

        /* write back hash table entry */
        current0 = (U32)(ip0 - base);
        hashTable[hash0] = current0;

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip0 + step;
        ip3 = ip1 + step;

        /* calculate step */
        if (ip2 >= nextStep) {
            step++;
            PREFETCH_L1(ip1 + 64);
            PREFETCH_L1(ip1 + 128);
            nextStep += kStepIncr;
        }
    } while (ip3 < ilimit);

_cleanup:
    /* Note that there are probably still a couple positions we could search.
     * However, it seems to be a meaningful performance hit to try to search
     * them. So let's not. */

    /* If offset_1 started invalid (offsetSaved1 != 0) and became valid (offset_1 != 0),
     * rotate saved offsets. See comment in ZSTD_compressBlock_fast_noDict for more context. */
    offsetSaved2 = ((offsetSaved1 != 0) && (offset_1 != 0)) ? offsetSaved1 : offsetSaved2;

    /* save reps for next block */
    rep[0] = offset_1 ? offset_1 : offsetSaved1;
    rep[1] = offset_2 ? offset_2 : offsetSaved2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);

_offset: /* Requires: ip0, idx, idxBase */

    /* Compute the offset code. */
    {   U32 const offset = current0 - idx;
        const BYTE* const lowMatchPtr = idx < prefixStartIndex ? dictStart : prefixStart;
        matchEnd = idx < prefixStartIndex ? dictEnd : iend;
        match0 = idxBase + idx;
        offset_2 = offset_1;
        offset_1 = offset;
        offcode = OFFSET_TO_OFFBASE(offset);
        mLength = 4;

        /* Count the backwards match length. */
        while (((ip0>anchor) & (match0>lowMatchPtr)) && (ip0[-1] == match0[-1])) {
            ip0--;
            match0--;
            mLength++;
    }   }

_match: /* Requires: ip0, match0, offcode, matchEnd */

    /* Count the forward length. */
    assert(matchEnd != 0);
    mLength += ZSTD_count_2segments(ip0 + mLength, match0 + mLength, iend, matchEnd, prefixStart);

    ZSTD_storeSeq(seqStore, (size_t)(ip0 - anchor), anchor, iend, offcode, mLength);

    ip0 += mLength;
    anchor = ip0;

    /* write next hash table entry */
    if (ip1 < ip0) {
        hashTable[hash1] = (U32)(ip1 - base);
    }

    /* Fill table and check for immediate repcode. */
    if (ip0 <= ilimit) {
        /* Fill Table */
        assert(base+current0+2 > istart);  /* check base overflow */
        hashTable[ZSTD_hashPtr(base+current0+2, hlog, mls)] = current0+2;  /* here because current+2 could be > iend-8 */
        hashTable[ZSTD_hashPtr(ip0-2, hlog, mls)] = (U32)(ip0-2-base);

        while (ip0 <= ilimit) {
            U32 const repIndex2 = (U32)(ip0-base) - offset_2;
            const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
            if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (offset_2 > 0))  /* intentional underflow */
                 && (MEM_read32(repMatch2) == MEM_read32(ip0)) ) {
                const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                size_t const repLength2 = ZSTD_count_2segments(ip0+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                hashTable[ZSTD_hashPtr(ip0, hlog, mls)] = (U32)(ip0-base);
                ip0 += repLength2;
                anchor = ip0;
                continue;
            }
            break;
    }   }

    goto _start;
}